

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.h
# Opt level: O2

_Bool run_container_contains(run_container_t *run,uint16_t pos)

{
  rle16_t *array;
  _Bool _Var1;
  int32_t iVar2;
  
  array = run->runs;
  iVar2 = interleavedBinarySearch(array,run->n_runs,pos);
  _Var1 = true;
  if ((iVar2 < 0) &&
     ((iVar2 == -1 ||
      ((int)(uint)array[-iVar2 - 2U].length < (int)((uint)pos - (uint)array[-iVar2 - 2U].value)))))
  {
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

inline bool run_container_contains(const run_container_t *run, uint16_t pos) {
    int32_t index = interleavedBinarySearch(run->runs, run->n_runs, pos);
    if (index >= 0) return true;
    index = -index - 2;  // points to preceding value, possibly -1
    if (index != -1) {   // possible match
        int32_t offset = pos - run->runs[index].value;
        int32_t le = run->runs[index].length;
        if (offset <= le) return true;
    }
    return false;
}